

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth2-client.c
# Opt level: O1

PktOut * ssh2_userauth_gss_packet(ssh2_userauth_state *s,char *authtype)

{
  BinarySink *pBVar1;
  ssh_gss_library *psVar2;
  _func_PktOut_ptr_int *p_Var3;
  int iVar4;
  strbuf *buf_o;
  PktOut *pPVar5;
  Ssh_gss_buf mic;
  Ssh_gss_buf buf;
  Ssh_gss_buf local_40;
  Ssh_gss_buf local_30;
  
  buf_o = strbuf_new();
  pBVar1 = buf_o->binarysink_;
  BinarySink_put_stringpl(pBVar1,s->session_id);
  BinarySink_put_byte(pBVar1,'2');
  BinarySink_put_stringz(pBVar1,s->username);
  BinarySink_put_stringz(pBVar1,s->successor_layer->vt->name);
  BinarySink_put_stringz(pBVar1,authtype);
  local_30.value = buf_o->s;
  local_30.length = buf_o->len;
  psVar2 = s->shgss->lib;
  (*psVar2->get_mic)(psVar2,s->shgss->ctx,&local_30,&local_40);
  strbuf_free(buf_o);
  iVar4 = strcmp(authtype,"gssapi-with-mic");
  p_Var3 = ((s->ppl).bpp)->vt->new_pktout;
  if (iVar4 == 0) {
    pPVar5 = (*p_Var3)(0x42);
  }
  else {
    pPVar5 = (*p_Var3)(0x32);
    pBVar1 = pPVar5->binarysink_;
    BinarySink_put_stringz(pBVar1,s->username);
    BinarySink_put_stringz(pBVar1,s->successor_layer->vt->name);
    BinarySink_put_stringz(pBVar1,authtype);
  }
  BinarySink_put_string(pPVar5->binarysink_,local_40.value,local_40.length);
  return pPVar5;
}

Assistant:

static PktOut *ssh2_userauth_gss_packet(
    struct ssh2_userauth_state *s, const char *authtype)
{
    strbuf *sb;
    PktOut *p;
    Ssh_gss_buf buf;
    Ssh_gss_buf mic;

    /*
     * The mic is computed over the session id + intended
     * USERAUTH_REQUEST packet.
     */
    sb = strbuf_new();
    put_stringpl(sb, s->session_id);
    put_byte(sb, SSH2_MSG_USERAUTH_REQUEST);
    put_stringz(sb, s->username);
    put_stringz(sb, s->successor_layer->vt->name);
    put_stringz(sb, authtype);

    /* Compute the mic */
    buf.value = sb->s;
    buf.length = sb->len;
    s->shgss->lib->get_mic(s->shgss->lib, s->shgss->ctx, &buf, &mic);
    strbuf_free(sb);

    /* Now we can build the real packet */
    if (strcmp(authtype, "gssapi-with-mic") == 0) {
        p = ssh_bpp_new_pktout(s->ppl.bpp, SSH2_MSG_USERAUTH_GSSAPI_MIC);
    } else {
        p = ssh_bpp_new_pktout(s->ppl.bpp, SSH2_MSG_USERAUTH_REQUEST);
        put_stringz(p, s->username);
        put_stringz(p, s->successor_layer->vt->name);
        put_stringz(p, authtype);
    }
    put_string(p, mic.value, mic.length);

    return p;
}